

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

bool __thiscall slang::CommandLine::parse(CommandLine *this,int argc,char **argv)

{
  char *__s;
  span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL> args_00;
  bool bVar1;
  ulong uVar2;
  SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_8UL> args;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_8UL> local_c8;
  
  SmallVector<std::basic_string_view<char,_std::char_traits<char>_>,_8UL>::SmallVector
            (&local_c8,(long)argc);
  if (0 < argc) {
    uVar2 = 0;
    do {
      __s = argv[uVar2];
      local_d8._M_len = strlen(__s);
      local_d8._M_str = __s;
      SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>>::
      emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                ((SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> *)&local_c8,
                 &local_d8);
      uVar2 = uVar2 + 1;
    } while ((uint)argc != uVar2);
  }
  args_00._M_extent._M_extent_value =
       local_c8.super_SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>.len;
  args_00._M_ptr =
       local_c8.super_SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>.data_;
  bVar1 = parse(this,args_00,(ParseOptions)0x0);
  if (local_c8.super_SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>.data_
      != (pointer)local_c8.
                  super_SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>.
                  firstElement) {
    operator_delete(local_c8.
                    super_SmallVectorBase<std::basic_string_view<char,_std::char_traits<char>_>_>.
                    data_);
  }
  return bVar1;
}

Assistant:

bool CommandLine::parse(int argc, const char* const argv[]) {
    SmallVector<std::string_view, 8> args{size_t(argc), UninitializedTag()};
    for (int i = 0; i < argc; i++)
        args.push_back(argv[i]);

    return parse(args);
}